

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::TParseContext::limitCheck
          (TParseContext *this,TSourceLoc *loc,int value,char *limit,char *feature)

{
  TSymbolTable *this_00;
  int iVar1;
  TSymbol *pTVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  pool_allocator<char> local_60;
  TString local_58;
  
  this_00 = (this->super_TParseContextBase).symbolTable;
  local_60.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_58,
             limit,&local_60);
  pTVar2 = TSymbolTable::find(this_00,&local_58,(bool *)0x0,(bool *)0x0,(int *)0x0);
  iVar1 = (*pTVar2->_vptr_TSymbol[9])(pTVar2);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    __assert_fail("symbol->getAsVariable()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                  ,0x1704,
                  "void glslang::TParseContext::limitCheck(const TSourceLoc &, int, const char *, const char *)"
                 );
  }
  iVar1 = (*pTVar2->_vptr_TSymbol[9])(pTVar2);
  lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0xb8))
                    ((long *)CONCAT44(extraout_var_00,iVar1));
  if (*(long *)(lVar3 + 8) != 0) {
    iVar1 = **(int **)(*(long *)(lVar3 + 8) + 8);
    if (iVar1 < value) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"must be less than or equal to",feature,"%s (%d)",limit,iVar1);
    }
    return;
  }
  __assert_fail("! constArray.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                ,0x1706,
                "void glslang::TParseContext::limitCheck(const TSourceLoc &, int, const char *, const char *)"
               );
}

Assistant:

void TParseContext::limitCheck(const TSourceLoc& loc, int value, const char* limit, const char* feature)
{
    TSymbol* symbol = symbolTable.find(limit);
    assert(symbol->getAsVariable());
    const TConstUnionArray& constArray = symbol->getAsVariable()->getConstArray();
    assert(! constArray.empty());
    if (value > constArray[0].getIConst())
        error(loc, "must be less than or equal to", feature, "%s (%d)", limit, constArray[0].getIConst());
}